

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  istream *this;
  ostream *poVar1;
  int iVar2;
  size_t sVar3;
  char *__end;
  int m;
  int n;
  int x_1;
  int x;
  priority_queue<int,_std::less<int>_> pq;
  int local_7c;
  int local_78;
  int local_74;
  long *local_70;
  long local_68;
  long local_60 [2];
  priority_queue<int,_std::less<int>_> local_50;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105168) = 0;
  local_50.mData = (int *)operator_new__(4);
  *local_50.mData = 0;
  local_50.mCap = 1;
  local_50.mSize = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_78);
  std::istream::operator>>(this,&local_7c);
  if (0 < local_78) {
    iVar2 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,(int *)&local_70);
      CP::priority_queue<int,_std::less<int>_>::push(&local_50,(int *)&local_70);
      iVar2 = iVar2 + 1;
    } while (iVar2 < local_78);
  }
  if (0 < local_7c) {
    iVar2 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_74);
      if (local_50.mSize != 0) {
        sVar3 = 0;
        do {
          sVar3 = sVar3 + 1;
        } while (local_50.mSize != sVar3);
      }
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\n","");
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_70,local_68);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < local_7c);
  }
  if (local_50.mData != (int *)0x0) {
    operator_delete__(local_50.mData);
  }
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(0);

  CP::priority_queue<int> pq;
  int n,m;
  std::cin >> n >> m;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    pq.push(x);
  }

  for (int i = 0;i < m;i++) {
    int x;
    std::cin >> x;
    std::cout << pq.get_rank(x) << std::endl;
  }
  
}